

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O0

__m128i dc_sum_32(uint16_t *ref)

{
  __m128i alVar1;
  __m128i sum_b;
  __m128i sum_a;
  __m128i zero;
  uint16_t *ref_00;
  
  ref_00 = (uint16_t *)0x0;
  dc_sum_16((uint16_t *)0x0);
  alVar1 = dc_sum_16(ref_00);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i dc_sum_32(const uint16_t *ref) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sum_a = dc_sum_16(ref);
  const __m128i sum_b = dc_sum_16(ref + 16);
  // 12 bit bd will outrange, so expand to 32 bit before adding final total
  return _mm_add_epi32(_mm_unpacklo_epi16(sum_a, zero),
                       _mm_unpacklo_epi16(sum_b, zero));
}